

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readBitsFromStream(size_t *bitpointer,uchar *bitstream,size_t nbits)

{
  uint local_28;
  uint local_24;
  uint i;
  uint result;
  size_t nbits_local;
  uchar *bitstream_local;
  size_t *bitpointer_local;
  
  local_24 = 0;
  for (local_28 = 0; local_28 != nbits; local_28 = local_28 + 1) {
    local_24 = (((int)(uint)bitstream[*bitpointer >> 3] >> ((byte)*bitpointer & 7) & 1U) <<
               ((byte)local_28 & 0x1f)) + local_24;
    *bitpointer = *bitpointer + 1;
  }
  return local_24;
}

Assistant:

static unsigned readBitsFromStream(size_t* bitpointer, const unsigned char* bitstream, size_t nbits)
{
  unsigned result = 0, i;
  for(i = 0; i != nbits; ++i)
  {
    result += ((unsigned)READBIT(*bitpointer, bitstream)) << i;
    ++(*bitpointer);
  }
  return result;
}